

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

SUNErrCode SUNLinSolSetATimes(SUNLinearSolver S,void *A_data,SUNATimesFn ATimes)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  SUNErrCode ier;
  undefined4 local_1c;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x10) == 0) {
    local_1c = 0;
  }
  else {
    local_1c = (**(code **)(*(long *)(in_RDI + 8) + 0x10))(in_RDI,in_RSI,in_RDX);
  }
  return local_1c;
}

Assistant:

SUNErrCode SUNLinSolSetATimes(SUNLinearSolver S, void* A_data, SUNATimesFn ATimes)
{
  SUNErrCode ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setatimes) { ier = S->ops->setatimes(S, A_data, ATimes); }
  else { ier = SUN_SUCCESS; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return (ier);
}